

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::to_texture_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Instruction *i,bool sparse,bool *forward
          ,SmallVector<unsigned_int,_8UL> *inherited_expressions)

{
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  SmallVector<unsigned_int,_8UL> *ts_2;
  bool local_289;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  uint local_144;
  undefined1 local_140 [4];
  uint32_t c_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  uint *local_100;
  uint *inherit;
  uint *__end4;
  uint *__begin4;
  SmallVector<unsigned_int,_8UL> *__range4;
  uint32_t temp_id;
  uint32_t c;
  undefined1 local_b8 [8];
  string inner_expr;
  TypedID<(spirv_cross::Types)2> local_84;
  SPIRVariable *local_80;
  SPIRVariable *var;
  MSLConstexprSampler *pMStack_70;
  bool is_dynamic_img_sampler;
  MSLConstexprSampler *constexpr_sampler;
  SPIRType *imgtype;
  SPIRType *type;
  bool is_gather;
  SPIRType *pSStack_50;
  Op op;
  SPIRType *result_type;
  uint32_t img;
  uint32_t result_type_id;
  uint32_t *ops;
  SmallVector<unsigned_int,_8UL> *inherited_expressions_local;
  bool *forward_local;
  Instruction *pIStack_20;
  bool sparse_local;
  Instruction *i_local;
  CompilerMSL *this_local;
  string *expr;
  
  ops = (uint32_t *)inherited_expressions;
  inherited_expressions_local = (SmallVector<unsigned_int,_8UL> *)forward;
  forward_local._7_1_ = sparse;
  pIStack_20 = i;
  i_local = (Instruction *)this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  _img = Compiler::stream((Compiler *)this,i);
  result_type._4_4_ = *_img;
  result_type._0_4_ = _img[2];
  pSStack_50 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type._4_4_);
  type._4_4_ = (uint)pIStack_20->op;
  local_289 = type._4_4_ == 0x60 || type._4_4_ == 0x61;
  type._3_1_ = local_289;
  imgtype = Compiler::expression_type((Compiler *)this,(uint32_t)result_type);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(imgtype->super_IVariant).self);
  constexpr_sampler =
       (MSLConstexprSampler *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  pMStack_70 = (MSLConstexprSampler *)0x0;
  var._7_1_ = 0;
  local_80 = Compiler::maybe_get_backing_variable((Compiler *)this,(uint32_t)result_type);
  if (local_80 != (SPIRVariable *)0x0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_80->basevariable);
    if (uVar2 == 0) {
      TypedID<(spirv_cross::Types)2>::TypedID(&local_84,&(local_80->super_IVariant).self);
    }
    else {
      local_84.id = (local_80->basevariable).id;
    }
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_84);
    pMStack_70 = find_constexpr_sampler(this,uVar2);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_80->super_IVariant).self);
    var._7_1_ = Compiler::has_extended_decoration
                          ((Compiler *)this,uVar2,SPIRVCrossDecorationDynamicImageSampler);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (((pMStack_70 == (MSLConstexprSampler *)0x0) ||
      ((pMStack_70->ycbcr_conversion_enable & 1U) == 0)) || ((var._7_1_ & 1) != 0)) {
    if (((((this->msl_options).swizzle_texture_samples & 1U) != 0) && ((type._3_1_ & 1) == 0)) &&
       ((bVar1 = Compiler::is_sampled_image_type((Compiler *)this,(SPIRType *)constexpr_sampler),
        bVar1 && ((var._7_1_ & 1) == 0)))) {
      add_spv_func_and_recompile(this,SPVFuncImplTextureSwizzle);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"spvTextureSwizzle(");
    }
  }
  else {
    switch(pMStack_70->ycbcr_model) {
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT709);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"spvConvertYCbCrBT709(");
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT601);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"spvConvertYCbCrBT601(");
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
      add_spv_func_and_recompile(this,SPVFuncImplConvertYCbCrBT2020);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"spvConvertYCbCrBT2020(");
      break;
    default:
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar3,"Invalid Y\'CbCr model conversion.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (pMStack_70->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY) {
      if (pMStack_70->ycbcr_range == MSL_SAMPLER_YCBCR_RANGE_ITU_FULL) {
        add_spv_func_and_recompile(this,SPVFuncImplExpandITUFullRange);
        ::std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"spvExpandITUFullRange(");
      }
      else {
        if (pMStack_70->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_NARROW) {
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar3,"Invalid Y\'CbCr range.");
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        add_spv_func_and_recompile(this,SPVFuncImplExpandITUNarrowRange);
        ::std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"spvExpandITUNarrowRange(");
      }
    }
  }
  ts_2 = inherited_expressions_local;
  CompilerGLSL::to_texture_op_abi_cxx11_
            ((string *)local_b8,&this->super_CompilerGLSL,pIStack_20,(bool)(forward_local._7_1_ & 1)
             ,(bool *)inherited_expressions_local,(SmallVector<unsigned_int,_8UL> *)ops);
  if (((pMStack_70 == (MSLConstexprSampler *)0x0) ||
      ((pMStack_70->ycbcr_conversion_enable & 1U) == 0)) || ((var._7_1_ & 1) != 0)) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_b8);
    if ((((((this->msl_options).swizzle_texture_samples & 1U) != 0) && ((type._3_1_ & 1) == 0)) &&
        (bVar1 = Compiler::is_sampled_image_type((Compiler *)this,(SPIRType *)constexpr_sampler),
        bVar1)) && ((var._7_1_ & 1) == 0)) {
      to_swizzle_expression_abi_cxx11_(&local_288,this,(uint32_t)result_type);
      ::std::operator+(&local_268,", ",&local_288);
      ::std::operator+(&local_248,&local_268,")");
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_248);
      ::std::__cxx11::string::~string((string *)&local_248);
      ::std::__cxx11::string::~string((string *)&local_268);
      ::std::__cxx11::string::~string((string *)&local_288);
      this->used_swizzle_buffer = true;
    }
  }
  else {
    bVar1 = MSLConstexprSampler::swizzle_is_identity(pMStack_70);
    if (bVar1) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_b8);
    }
    else {
      bVar1 = MSLConstexprSampler::swizzle_has_one_or_zero(pMStack_70);
      if (bVar1) {
        __range4._0_4_ =
             ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        ts_2 = (SmallVector<unsigned_int,_8UL> *)0x0;
        CompilerGLSL::emit_op
                  (&this->super_CompilerGLSL,result_type._4_4_,(uint32_t)__range4,(string *)local_b8
                   ,false,false);
        __begin4 = ops;
        __end4 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)ops);
        inherit = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin4);
        for (; __end4 != inherit; __end4 = __end4 + 1) {
          local_100 = __end4;
          Compiler::inherit_expression_dependencies((Compiler *)this,(uint32_t)__range4,*__end4);
        }
        SmallVector<unsigned_int,_8UL>::clear((SmallVector<unsigned_int,_8UL> *)ops);
        SmallVector<unsigned_int,_8UL>::push_back
                  ((SmallVector<unsigned_int,_8UL> *)ops,(uint *)&__range4);
        if (((type._4_4_ == 0x57) || (type._4_4_ == 0x59)) ||
           ((type._4_4_ == 0x5b || (type._4_4_ == 0x5d)))) {
          CompilerGLSL::register_control_dependent_expression
                    (&this->super_CompilerGLSL,(uint32_t)__range4);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_140,this,pSStack_50,0);
        ::std::operator+(&local_120,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"(");
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_120);
        ::std::__cxx11::string::~string((string *)&local_120);
        ::std::__cxx11::string::~string((string *)local_140);
        for (local_144 = 0; local_144 < 4; local_144 = local_144 + 1) {
          switch(pMStack_70->swizzle[local_144]) {
          case MSL_COMPONENT_SWIZZLE_IDENTITY:
            CompilerGLSL::to_expression_abi_cxx11_
                      (&local_1a8,&this->super_CompilerGLSL,(uint32_t)__range4,true);
            ::std::operator+(&local_188,&local_1a8,".");
            ::std::operator+(&local_168,&local_188,"rgba"[local_144]);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_168);
            ::std::__cxx11::string::~string((string *)&local_168);
            ::std::__cxx11::string::~string((string *)&local_188);
            ::std::__cxx11::string::~string((string *)&local_1a8);
            break;
          case MSL_COMPONENT_SWIZZLE_ZERO:
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"0");
            break;
          case MSL_COMPONENT_SWIZZLE_ONE:
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"1");
            break;
          case MSL_COMPONENT_SWIZZLE_R:
          case MSL_COMPONENT_SWIZZLE_G:
          case MSL_COMPONENT_SWIZZLE_B:
          case MSL_COMPONENT_SWIZZLE_A:
            CompilerGLSL::to_expression_abi_cxx11_
                      (&local_208,&this->super_CompilerGLSL,(uint32_t)__range4,true);
            ::std::operator+(&local_1e8,&local_208,".");
            ::std::operator+(&local_1c8,&local_1e8,
                             "rgba"[(int)(pMStack_70->swizzle[local_144] - MSL_COMPONENT_SWIZZLE_R)]
                            );
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_1c8);
            ::std::__cxx11::string::~string((string *)&local_1c8);
            ::std::__cxx11::string::~string((string *)&local_1e8);
            ::std::__cxx11::string::~string((string *)&local_208);
            break;
          default:
            pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar3,"Invalid component swizzle.");
            __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (local_144 < 3) {
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
          }
        }
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
      }
      else {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &temp_id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,".");
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&temp_id);
        ::std::__cxx11::string::~string((string *)&temp_id);
        for (__range4._4_4_ = 0; __range4._4_4_ < 4; __range4._4_4_ = __range4._4_4_ + 1) {
          if (pMStack_70->swizzle[__range4._4_4_] == MSL_COMPONENT_SWIZZLE_IDENTITY) {
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,"rgba"[__range4._4_4_]);
          }
          else {
            if (3 < pMStack_70->swizzle[__range4._4_4_] - MSL_COMPONENT_SWIZZLE_R) {
              pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(pCVar3,"Invalid component swizzle.");
              __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,
                       "rgba"[(int)(pMStack_70->swizzle[__range4._4_4_] - MSL_COMPONENT_SWIZZLE_R)])
            ;
          }
        }
      }
    }
    if (pMStack_70->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY) {
      join<char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                (&local_228,(spirv_cross *)0x4a12ae,(char (*) [3])&pMStack_70->bpc,(uint *)0x4b01ae,
                 (char (*) [2])ts_2);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_228);
      ::std::__cxx11::string::~string((string *)&local_228);
      if (pMStack_70->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
      }
    }
  }
  ::std::__cxx11::string::~string((string *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_texture_op(const Instruction &i, bool sparse, bool *forward,
                                  SmallVector<uint32_t> &inherited_expressions)
{
	auto *ops = stream(i);
	uint32_t result_type_id = ops[0];
	uint32_t img = ops[2];
	auto &result_type = get<SPIRType>(result_type_id);
	auto op = static_cast<Op>(i.op);
	bool is_gather = (op == OpImageGather || op == OpImageDrefGather);

	// Bypass pointers because we need the real image struct
	auto &type = expression_type(img);
	auto &imgtype = get<SPIRType>(type.self);

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	string expr;
	if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable && !is_dynamic_img_sampler)
	{
		// If this needs sampler Y'CbCr conversion, we need to do some additional
		// processing.
		switch (constexpr_sampler->ycbcr_model)
		{
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
			// Default
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT709);
			expr += "spvConvertYCbCrBT709(";
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT601);
			expr += "spvConvertYCbCrBT601(";
			break;
		case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
			add_spv_func_and_recompile(SPVFuncImplConvertYCbCrBT2020);
			expr += "spvConvertYCbCrBT2020(";
			break;
		default:
			SPIRV_CROSS_THROW("Invalid Y'CbCr model conversion.");
		}

		if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY)
		{
			switch (constexpr_sampler->ycbcr_range)
			{
			case MSL_SAMPLER_YCBCR_RANGE_ITU_FULL:
				add_spv_func_and_recompile(SPVFuncImplExpandITUFullRange);
				expr += "spvExpandITUFullRange(";
				break;
			case MSL_SAMPLER_YCBCR_RANGE_ITU_NARROW:
				add_spv_func_and_recompile(SPVFuncImplExpandITUNarrowRange);
				expr += "spvExpandITUNarrowRange(";
				break;
			default:
				SPIRV_CROSS_THROW("Invalid Y'CbCr range.");
			}
		}
	}
	else if (msl_options.swizzle_texture_samples && !is_gather && is_sampled_image_type(imgtype) &&
	         !is_dynamic_img_sampler)
	{
		add_spv_func_and_recompile(SPVFuncImplTextureSwizzle);
		expr += "spvTextureSwizzle(";
	}

	string inner_expr = CompilerGLSL::to_texture_op(i, sparse, forward, inherited_expressions);

	if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable && !is_dynamic_img_sampler)
	{
		if (!constexpr_sampler->swizzle_is_identity())
		{
			static const char swizzle_names[] = "rgba";
			if (!constexpr_sampler->swizzle_has_one_or_zero())
			{
				// If we can, do it inline.
				expr += inner_expr + ".";
				for (uint32_t c = 0; c < 4; c++)
				{
					switch (constexpr_sampler->swizzle[c])
					{
					case MSL_COMPONENT_SWIZZLE_IDENTITY:
						expr += swizzle_names[c];
						break;
					case MSL_COMPONENT_SWIZZLE_R:
					case MSL_COMPONENT_SWIZZLE_G:
					case MSL_COMPONENT_SWIZZLE_B:
					case MSL_COMPONENT_SWIZZLE_A:
						expr += swizzle_names[constexpr_sampler->swizzle[c] - MSL_COMPONENT_SWIZZLE_R];
						break;
					default:
						SPIRV_CROSS_THROW("Invalid component swizzle.");
					}
				}
			}
			else
			{
				// Otherwise, we need to emit a temporary and swizzle that.
				uint32_t temp_id = ir.increase_bound_by(1);
				emit_op(result_type_id, temp_id, inner_expr, false);
				for (auto &inherit : inherited_expressions)
					inherit_expression_dependencies(temp_id, inherit);
				inherited_expressions.clear();
				inherited_expressions.push_back(temp_id);

				switch (op)
				{
				case OpImageSampleDrefImplicitLod:
				case OpImageSampleImplicitLod:
				case OpImageSampleProjImplicitLod:
				case OpImageSampleProjDrefImplicitLod:
					register_control_dependent_expression(temp_id);
					break;

				default:
					break;
				}
				expr += type_to_glsl(result_type) + "(";
				for (uint32_t c = 0; c < 4; c++)
				{
					switch (constexpr_sampler->swizzle[c])
					{
					case MSL_COMPONENT_SWIZZLE_IDENTITY:
						expr += to_expression(temp_id) + "." + swizzle_names[c];
						break;
					case MSL_COMPONENT_SWIZZLE_ZERO:
						expr += "0";
						break;
					case MSL_COMPONENT_SWIZZLE_ONE:
						expr += "1";
						break;
					case MSL_COMPONENT_SWIZZLE_R:
					case MSL_COMPONENT_SWIZZLE_G:
					case MSL_COMPONENT_SWIZZLE_B:
					case MSL_COMPONENT_SWIZZLE_A:
						expr += to_expression(temp_id) + "." +
						        swizzle_names[constexpr_sampler->swizzle[c] - MSL_COMPONENT_SWIZZLE_R];
						break;
					default:
						SPIRV_CROSS_THROW("Invalid component swizzle.");
					}
					if (c < 3)
						expr += ", ";
				}
				expr += ")";
			}
		}
		else
			expr += inner_expr;
		if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY)
		{
			expr += join(", ", constexpr_sampler->bpc, ")");
			if (constexpr_sampler->ycbcr_model != MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY)
				expr += ")";
		}
	}
	else
	{
		expr += inner_expr;
		if (msl_options.swizzle_texture_samples && !is_gather && is_sampled_image_type(imgtype) &&
		    !is_dynamic_img_sampler)
		{
			// Add the swizzle constant from the swizzle buffer.
			expr += ", " + to_swizzle_expression(img) + ")";
			used_swizzle_buffer = true;
		}
	}

	return expr;
}